

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     call_assignment_no_alias<Eigen::Ref<Eigen::Matrix<double,1,2,1,1,2>,0,Eigen::InnerStride<1>>,Eigen::Ref<Eigen::Matrix<double,1,2,1,1,2>,0,Eigen::InnerStride<1>>,Eigen::internal::assign_op<double,double>>
               (Ref<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0,_Eigen::InnerStride<1>_> *dst,
               Ref<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0,_Eigen::InnerStride<1>_> *src,
               assign_op<double,_double> *func)

{
  ActualDstType actualDst;
  assign_op<double,_double> *func_local;
  Ref<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0,_Eigen::InnerStride<1>_> *src_local;
  Ref<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0,_Eigen::InnerStride<1>_> *dst_local;
  
  Assignment<Eigen::Ref<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0,_Eigen::InnerStride<1>_>,_Eigen::Ref<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0,_Eigen::InnerStride<1>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run(dst,src,func);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE
void call_assignment_no_alias(Dst& dst, const Src& src, const Func& func)
{
  enum {
    NeedToTranspose = (    (int(Dst::RowsAtCompileTime) == 1 && int(Src::ColsAtCompileTime) == 1)
                        || (int(Dst::ColsAtCompileTime) == 1 && int(Src::RowsAtCompileTime) == 1)
                      ) && int(Dst::SizeAtCompileTime) != 1
  };

  typedef typename internal::conditional<NeedToTranspose, Transpose<Dst>, Dst>::type ActualDstTypeCleaned;
  typedef typename internal::conditional<NeedToTranspose, Transpose<Dst>, Dst&>::type ActualDstType;
  ActualDstType actualDst(dst);
  
  // TODO check whether this is the right place to perform these checks:
  EIGEN_STATIC_ASSERT_LVALUE(Dst)
  EIGEN_STATIC_ASSERT_SAME_MATRIX_SIZE(ActualDstTypeCleaned,Src)
  EIGEN_CHECK_BINARY_COMPATIBILIY(Func,typename ActualDstTypeCleaned::Scalar,typename Src::Scalar);
  
  Assignment<ActualDstTypeCleaned,Src,Func>::run(actualDst, src, func);
}